

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_ecc.c
# Opt level: O0

bitcount_t tc_uECC_vli_numBits(tc_uECC_word_t *vli,wordcount_t max_words)

{
  wordcount_t wVar1;
  short sVar2;
  uint local_24;
  wordcount_t num_digits;
  tc_uECC_word_t digit;
  tc_uECC_word_t i;
  wordcount_t max_words_local;
  tc_uECC_word_t *vli_local;
  
  wVar1 = vli_numDigits(vli,max_words);
  if (wVar1 == '\0') {
    vli_local._6_2_ = 0;
  }
  else {
    sVar2 = 0;
    for (local_24 = vli[wVar1 + -1]; local_24 != 0; local_24 = local_24 >> 1) {
      sVar2 = sVar2 + 1;
    }
    vli_local._6_2_ = (wVar1 + -1) * 0x20 + sVar2;
  }
  return vli_local._6_2_;
}

Assistant:

bitcount_t tc_uECC_vli_numBits(const tc_uECC_word_t *vli,
			    const wordcount_t max_words)
{

	tc_uECC_word_t i;
	tc_uECC_word_t digit;

	wordcount_t num_digits = vli_numDigits(vli, max_words);
	if (num_digits == 0) {
		return 0;
	}

	digit = vli[num_digits - 1];
	for (i = 0; digit; ++i) {
		digit >>= 1;
	}

	return (((bitcount_t)(num_digits - 1) << tc_uECC_WORD_BITS_SHIFT) + i);
}